

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  libssh2_nonblocking_states *plVar1;
  uchar *puVar2;
  libssh2_nonblocking_states lVar3;
  int iVar4;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar5;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar8;
  uchar *buf_00;
  uchar *data;
  size_t data_len;
  string_buf buf;
  uchar *extname;
  uchar *local_80;
  size_t local_78;
  uchar *local_70;
  time_t local_68;
  string_buf local_60;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 4) != 0) {
      start_time = time((time_t *)0x0);
      plVar1 = &session->sftpInit_state;
      buf_00 = session->sftpInit_buffer;
      local_48 = session->sftpInit_buffer + 5;
LAB_00122395:
      local_78 = 0;
      lVar3 = session->sftpInit_state;
      sftp = session->sftpInit_sftp;
      switch(lVar3) {
      case libssh2_NB_state_idle:
        goto switchD_001223c3_caseD_0;
      default:
        goto switchD_001223c3_caseD_1;
      case libssh2_NB_state_created:
        goto switchD_001223c3_caseD_2;
      case libssh2_NB_state_sent:
        pLVar5 = session->sftpInit_channel;
        goto LAB_00122422;
      case libssh2_NB_state_sent1:
        goto switchD_001223c3_caseD_4;
      case libssh2_NB_state_sent2:
        sVar7 = session->sftpInit_sent;
        goto LAB_0012250b;
      }
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
switchD_001223c3_caseD_0:
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    __assert_fail("!session->sftpInit_sftp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                  ,0x335,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
  }
  *plVar1 = libssh2_NB_state_created;
switchD_001223c3_caseD_2:
  pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->sftpInit_channel = pLVar5;
  if (pLVar5 == (LIBSSH2_CHANNEL *)0x0) {
    iVar4 = libssh2_session_last_errno(session);
    if (iVar4 == -0x25) {
      pcVar8 = "Would block starting up channel";
      goto LAB_00122650;
    }
    _libssh2_error(session,-0x15,"Unable to startup channel");
    session->sftpInit_state = libssh2_NB_state_idle;
  }
  else {
    *plVar1 = libssh2_NB_state_sent;
LAB_00122422:
    iVar4 = _libssh2_channel_process_startup(pLVar5,"subsystem",9,"sftp",4);
    if (iVar4 == 0) {
      *plVar1 = libssh2_NB_state_sent1;
switchD_001223c3_caseD_4:
      iVar4 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
      if (iVar4 != -0x25) {
        sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x168);
        session->sftpInit_sftp = sftp;
        if (sftp == (LIBSSH2_SFTP *)0x0) {
          iVar4 = -6;
          pcVar8 = "Unable to allocate a new SFTP structure";
          goto LAB_00122719;
        }
        sftp->channel = session->sftpInit_channel;
        sftp->request_id = 0;
        _libssh2_htonu32(buf_00,5);
        session->sftpInit_buffer[4] = '\x01';
        _libssh2_htonu32(local_48,3);
        session->sftpInit_sent = 0;
        session->sftpInit_state = libssh2_NB_state_sent2;
        sVar7 = 0;
LAB_0012250b:
        sVar6 = _libssh2_channel_write(session->sftpInit_channel,0,buf_00 + sVar7,9 - sVar7);
        if (sVar6 == -0x25) {
          pcVar8 = "Would block sending SSH_FXP_INIT";
          goto LAB_00122650;
        }
        if (sVar6 < 0) {
          iVar4 = -7;
          pcVar8 = "Unable to send SSH_FXP_INIT";
LAB_00122719:
          _libssh2_error(session,iVar4,pcVar8);
        }
        else {
          sVar7 = sVar6 + session->sftpInit_sent;
          session->sftpInit_sent = sVar7;
          if (sVar7 == 9) {
            *plVar1 = libssh2_NB_state_sent3;
          }
          else {
            lVar3 = *plVar1;
switchD_001223c3_caseD_1:
            if (lVar3 == libssh2_NB_state_error_closing) {
              iVar4 = _libssh2_channel_free(session->sftpInit_channel);
              if (iVar4 != -0x25) {
                session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
                if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
                  (*session->free)(session->sftpInit_sftp,&session->abstract);
                  session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
                }
                *plVar1 = libssh2_NB_state_idle;
                goto LAB_00122725;
              }
              pcVar8 = "Would block closing channel";
              goto LAB_00122650;
            }
          }
          iVar4 = sftp_packet_require(sftp,'\x02',0,&local_80,&local_78,5);
          sVar7 = local_78;
          puVar2 = local_80;
          if (iVar4 == -0x26) {
            if (local_78 != 0) {
              (*session->free)(local_80,&session->abstract);
            }
            iVar4 = -0x1f;
            pcVar8 = "Invalid SSH_FXP_VERSION response";
            goto LAB_00122719;
          }
          if (iVar4 != 0) {
            if (iVar4 == -0x25) {
              pcVar8 = "Would block receiving SSH_FXP_VERSION";
              goto LAB_00122650;
            }
            pcVar8 = "Timeout waiting for response from SFTP subsystem";
            goto LAB_00122719;
          }
          local_60.data = local_80;
          local_60.dataptr = local_80 + 1;
          local_60.len = local_78;
          out = &sftp->version;
          local_70 = buf_00;
          local_68 = start_time;
          iVar4 = _libssh2_get_u32(&local_60,out);
          start_time = local_68;
          if (iVar4 == 0) {
            if (3 < *out) {
              *out = 3;
            }
            do {
              if (puVar2 + sVar7 <= local_60.dataptr) {
                (*session->free)(local_80,&session->abstract);
                pLVar5 = sftp->channel;
                pLVar5->abstract = sftp;
                pLVar5->close_cb = libssh2_sftp_dtor;
                *(undefined8 *)plVar1 = 0;
                *(undefined8 *)((long)&session->sftpInit_sftp + 4) = 0;
                *(undefined4 *)((long)&session->sftpInit_channel + 4) = 0;
                _libssh2_list_init(&sftp->sftp_handles);
                return sftp;
              }
              iVar4 = _libssh2_get_string(&local_60,&local_38,(size_t *)0x0);
              if (iVar4 != 0) {
                (*session->free)(local_80,&session->abstract);
                pcVar8 = "Data too short when extracting extname";
                goto LAB_001227d8;
              }
              iVar4 = _libssh2_get_string(&local_60,&local_40,(size_t *)0x0);
            } while (iVar4 == 0);
            (*session->free)(local_80,&session->abstract);
            pcVar8 = "Data too short when extracting extdata";
LAB_001227d8:
            _libssh2_error(session,-0x26,pcVar8);
            buf_00 = local_70;
          }
          else {
            (*session->free)(local_80,&session->abstract);
            start_time = local_68;
            buf_00 = local_70;
          }
        }
        *plVar1 = libssh2_NB_state_error_closing;
        goto LAB_00122725;
      }
      pcVar8 = "Would block requesting handle extended data";
    }
    else {
      if (iVar4 != -0x25) {
        iVar4 = -0x15;
        pcVar8 = "Unable to request SFTP subsystem";
        goto LAB_00122719;
      }
      pcVar8 = "Would block to request SFTP subsystem";
    }
LAB_00122650:
    _libssh2_error(session,-0x25,pcVar8);
  }
LAB_00122725:
  if (session->api_block_mode == 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = libssh2_session_last_errno(session);
  if (iVar4 != -0x25) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = _libssh2_wait_socket(session,start_time);
  if (iVar4 != 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  goto LAB_00122395;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}